

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O1

vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *
jhu::thrax::minimalConsistentPairs
          (vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
           *__return_storage_ptr__,Alignment *a,int maxSize)

{
  ushort uVar1;
  pointer pPVar2;
  SpanPair *pSVar3;
  SpanPair sp;
  bool bVar4;
  optional<jhu::thrax::Span> oVar5;
  short sVar6;
  int iVar7;
  pointer pSVar8;
  int iVar9;
  SpanPair *pSVar10;
  pointer pSVar11;
  long lVar12;
  Span src;
  SpanPair *pSVar13;
  pointer pSVar14;
  int iVar15;
  pointer pPVar16;
  pointer local_58;
  SpanPair local_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::reserve
            (__return_storage_ptr__,
             ((long)(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * (long)maxSize);
  local_58 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_58 != local_38) {
    do {
      pPVar16 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar16 != pPVar2) {
        uVar1 = local_58->src;
        iVar15 = (uint)uVar1 << 0x10;
        do {
          iVar7 = (ushort)pPVar16->src + 1;
          iVar9 = 5;
          sVar6 = (short)iVar7;
          if ((short)uVar1 < sVar6) {
            pSVar8 = (__return_storage_ptr__->
                     super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pSVar14 = (__return_storage_ptr__->
                      super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            src = (Span)(iVar7 * 0x10000 | (uint)uVar1);
            lVar12 = (long)pSVar14 - (long)pSVar8 >> 5;
            iVar7 = (int)sVar6;
            pSVar11 = pSVar8;
            if (0 < lVar12) {
              pSVar11 = (pointer)((long)&(pSVar8->src).start +
                                 ((long)pSVar14 - (long)pSVar8 & 0xffffffffffffffe0U));
              lVar12 = lVar12 + 1;
              pSVar8 = pSVar8 + 2;
              do {
                if (((int)pSVar8[-2].src << 0x10 == iVar15) &&
                   ((int)pSVar8[-2].src >> 0x10 == iVar7)) {
                  pSVar8 = pSVar8 + -2;
                  goto LAB_0010a030;
                }
                if (((int)pSVar8[-1].src << 0x10 == iVar15) &&
                   ((int)pSVar8[-1].src >> 0x10 == iVar7)) {
                  pSVar8 = pSVar8 + -1;
                  goto LAB_0010a030;
                }
                if (((int)pSVar8->src << 0x10 == iVar15) && ((int)pSVar8->src >> 0x10 == iVar7))
                goto LAB_0010a030;
                if (((int)pSVar8[1].src << 0x10 == iVar15) && ((int)pSVar8[1].src >> 0x10 == iVar7))
                {
                  pSVar8 = pSVar8 + 1;
                  goto LAB_0010a030;
                }
                lVar12 = lVar12 + -1;
                pSVar8 = pSVar8 + 4;
              } while (1 < lVar12);
            }
            lVar12 = (long)pSVar14 - (long)pSVar11 >> 3;
            if (lVar12 == 1) {
LAB_0010a014:
              pSVar8 = pSVar11;
              if (src != pSVar11->src) {
                pSVar8 = pSVar14;
              }
            }
            else if (lVar12 == 2) {
LAB_0010a00b:
              pSVar8 = pSVar11;
              if (src != pSVar11->src) {
                pSVar11 = pSVar11 + 1;
                goto LAB_0010a014;
              }
            }
            else {
              pSVar8 = pSVar14;
              if ((lVar12 == 3) && (pSVar8 = pSVar11, src != pSVar11->src)) {
                pSVar11 = pSVar11 + 1;
                goto LAB_0010a00b;
              }
            }
LAB_0010a030:
            if (pSVar8 == pSVar14) {
              iVar9 = iVar7 - (short)uVar1;
              if (iVar7 - (short)uVar1 < 1) {
                iVar9 = 0;
              }
              bVar4 = iVar9 <= maxSize;
              iVar9 = (uint)(maxSize < iVar9) << 2;
            }
            else {
              iVar9 = 5;
              bVar4 = false;
            }
            if (bVar4) {
              oVar5 = minimalTargetSpan(a,src);
              iVar9 = 0;
              if (((uint6)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                          super__Optional_payload_base<jhu::thrax::Span> & 0x100000000) != 0) {
                iVar7 = (int)(short)(((ulong)(uint6)oVar5.
                                                  super__Optional_base<jhu::thrax::Span,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<jhu::thrax::Span> &
                                     0xffffffff0000) >> 0x10) -
                        (int)(short)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>.
                                    _M_payload.super__Optional_payload_base<jhu::thrax::Span>.
                                    _M_payload._0_2_;
                iVar9 = 0;
                if (iVar7 < 1) {
                  iVar7 = iVar9;
                }
                if (iVar7 <= maxSize) {
                  local_40.tgt = (Span)((uint)oVar5.
                                              super__Optional_base<jhu::thrax::Span,_true,_true>.
                                              _M_payload.
                                              super__Optional_payload_base<jhu::thrax::Span>.
                                              _M_payload._0_2_ |
                                       (int)(((ulong)(uint6)oVar5.
                                                  super__Optional_base<jhu::thrax::Span,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<jhu::thrax::Span> &
                                             0xffffffff0000) >> 0x10) << 0x10);
                  local_40.src = src;
                  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::
                  emplace_back<jhu::thrax::SpanPair>(__return_storage_ptr__,&local_40);
                }
              }
            }
          }
        } while (((iVar9 == 5) || (iVar9 == 0)) && (pPVar16 = pPVar16 + 1, pPVar16 != pPVar2));
      }
      local_58 = local_58 + 1;
    } while (local_58 != local_38);
  }
  pSVar13 = (__return_storage_ptr__->
            super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar3 = (__return_storage_ptr__->
           super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar12 = (long)pSVar3 - (long)pSVar13 >> 5;
  pSVar10 = pSVar13;
  if (0 < lVar12) {
    pSVar10 = (SpanPair *)
              ((long)&(pSVar13->src).start + ((long)pSVar3 - (long)pSVar13 & 0xffffffffffffffe0U));
    lVar12 = lVar12 + 1;
    pSVar13 = pSVar13 + 2;
    do {
      bVar4 = isConsistent(a,pSVar13[-2]);
      if (!bVar4) {
        pSVar13 = pSVar13 + -2;
        goto LAB_0010a1e9;
      }
      bVar4 = isConsistent(a,pSVar13[-1]);
      if (!bVar4) {
        pSVar13 = pSVar13 + -1;
        goto LAB_0010a1e9;
      }
      bVar4 = isConsistent(a,*pSVar13);
      if (!bVar4) goto LAB_0010a1e9;
      bVar4 = isConsistent(a,pSVar13[1]);
      if (!bVar4) {
        pSVar13 = pSVar13 + 1;
        goto LAB_0010a1e9;
      }
      lVar12 = lVar12 + -1;
      pSVar13 = pSVar13 + 4;
    } while (1 < lVar12);
  }
  lVar12 = (long)pSVar3 - (long)pSVar10 >> 3;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      pSVar13 = pSVar3;
      if ((lVar12 != 3) || (bVar4 = isConsistent(a,*pSVar10), pSVar13 = pSVar10, !bVar4))
      goto LAB_0010a1e9;
      pSVar10 = pSVar10 + 1;
    }
    bVar4 = isConsistent(a,*pSVar10);
    pSVar13 = pSVar10;
    if (!bVar4) goto LAB_0010a1e9;
    pSVar10 = pSVar10 + 1;
  }
  bVar4 = isConsistent(a,*pSVar10);
  pSVar13 = pSVar10;
  if (bVar4) {
    pSVar13 = pSVar3;
  }
LAB_0010a1e9:
  pSVar10 = pSVar13 + 1;
  if (pSVar10 != pSVar3 && pSVar13 != pSVar3) {
    do {
      sp = *pSVar10;
      bVar4 = isConsistent(a,sp);
      if (bVar4) {
        *pSVar13 = sp;
        pSVar13 = pSVar13 + 1;
      }
      pSVar10 = pSVar10 + 1;
    } while (pSVar10 != pSVar3);
  }
  pSVar3 = (__return_storage_ptr__->
           super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pSVar13 != pSVar3) &&
     (pSVar8 = (__return_storage_ptr__->
               super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>).
               _M_impl.super__Vector_impl_data._M_finish,
     pSVar14 = (pointer)((long)pSVar13 + ((long)pSVar8 - (long)pSVar3)), pSVar8 != pSVar14)) {
    (__return_storage_ptr__->
    super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
    super__Vector_impl_data._M_finish = pSVar14;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SpanPair> minimalConsistentPairs(const Alignment& a, int maxSize) {
  std::vector<SpanPair> result;
  result.reserve(maxSize * a.size());  // over-estimate
  for (auto startPoint : a) {
    for (auto endPoint : a) {
      Span src{ startPoint.src, static_cast<IndexType>(endPoint.src + 1) };
      if (src.empty()) {
        continue;
      } else if (auto it = std::find_if(
          result.begin(), result.end(), [src](auto p) { return src == p.src; });
          it != result.end()) {
        continue;
      } else if (src.size() > maxSize) {
        break;
      }
      if (auto tgt = minimalTargetSpan(a, src);
          tgt.has_value() && tgt->size() <= maxSize) {
        result.push_back(SpanPair{ src, *tgt });
      }
    }
  }
  auto it = std::remove_if(
      result.begin(),
      result.end(),
      [&a](auto sp) { return !isConsistent(a, sp); });
  result.erase(it, result.end());
  return result;
}